

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * lj_strfmt_putfnum_uint(SBuf *sb,SFormat sf,lua_Number n)

{
  SBuf *pSVar1;
  undefined8 local_28;
  int64_t k;
  lua_Number n_local;
  SFormat sf_local;
  SBuf *sb_local;
  
  if (n < 9.223372036854776e+18) {
    local_28 = (uint64_t)n;
  }
  else {
    local_28 = (uint64_t)(n - 1.8446744073709552e+19);
  }
  pSVar1 = lj_strfmt_putfxint(sb,sf,local_28);
  return pSVar1;
}

Assistant:

SBuf *lj_strfmt_putfnum_uint(SBuf *sb, SFormat sf, lua_Number n)
{
  int64_t k;
  if (n >= 9223372036854775808.0)
    k = (int64_t)(n - 18446744073709551616.0);
  else
    k = (int64_t)n;
  return lj_strfmt_putfxint(sb, sf, (uint64_t)k);
}